

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_guardcc(ASMState *as,int cc)

{
  MCode *pMVar1;
  int iVar2;
  MCode *p;
  int iVar3;
  long lVar4;
  byte bVar5;
  
  bVar5 = (byte)cc;
  pMVar1 = as->mcp;
  iVar3 = (as->snapno & 0x1f) * 4 + (int)as->J->exitstubgroup[as->snapno >> 5];
  iVar2 = (int)pMVar1;
  if (pMVar1 == as->invmcp) {
    as->loopinv = 1;
    *(int *)(pMVar1 + 1) = (iVar3 - iVar2) + -5;
    bVar5 = bVar5 ^ 1;
    iVar3 = iVar2;
    if (as->realign != (MCode *)0x0) {
      pMVar1[-1] = '\0';
      bVar5 = bVar5 & 0xf | 0x70;
      lVar4 = -2;
      goto LAB_0013ff5f;
    }
  }
  *(int *)(pMVar1 + -4) = iVar3 - iVar2;
  pMVar1[-5] = bVar5 & 0xf | 0x80;
  bVar5 = 0xf;
  lVar4 = -6;
LAB_0013ff5f:
  pMVar1[lVar4] = bVar5;
  as->mcp = pMVar1 + lVar4;
  return;
}

Assistant:

static void asm_guardcc(ASMState *as, int cc)
{
  MCode *target = exitstub_addr(as->J, as->snapno);
  MCode *p = as->mcp;
  if (LJ_UNLIKELY(p == as->invmcp)) {
    as->loopinv = 1;
    *(int32_t *)(p+1) = jmprel(p+5, target);
    target = p;
    cc ^= 1;
    if (as->realign) {
      emit_sjcc(as, cc, target);
      return;
    }
  }
  emit_jcc(as, cc, target);
}